

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-internal-utils.cc
# Opt level: O0

void __thiscall
testing::internal::GoogleTestFailureReporter::ReportFailure
          (GoogleTestFailureReporter *this,FailureType type,char *file,int line,string *message)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  AssertHelper local_40 [8];
  Message local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  string *message_local;
  char *pcStack_20;
  int line_local;
  char *file_local;
  GoogleTestFailureReporter *pGStack_10;
  FailureType type_local;
  GoogleTestFailureReporter *this_local;
  
  local_30 = message;
  message_local._4_4_ = line;
  pcStack_20 = file;
  file_local._4_4_ = type;
  pGStack_10 = this;
  testing::Message::Message(&local_38);
  pcVar2 = pcStack_20;
  iVar1 = message_local._4_4_;
  bVar4 = file_local._4_4_ == kFatal;
  pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (local_30);
  testing::internal::AssertHelper::AssertHelper
            (local_40,bVar4 + kNonFatalFailure,pcVar2,iVar1,pcVar3);
  testing::internal::AssertHelper::operator=(local_40,&local_38);
  testing::internal::AssertHelper::~AssertHelper(local_40);
  Message::~Message(&local_38);
  if (file_local._4_4_ == kFatal) {
    posix::Abort();
  }
  return;
}

Assistant:

void ReportFailure(FailureType type, const char* file, int line,
                     const std::string& message) override {
    AssertHelper(type == kFatal ?
                 TestPartResult::kFatalFailure :
                 TestPartResult::kNonFatalFailure,
                 file,
                 line,
                 message.c_str()) = Message();
    if (type == kFatal) {
      posix::Abort();
    }
  }